

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IsGroupOf_PDU::SetGED(IsGroupOf_PDU *this,GEDList *GED)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  GED *pGVar4;
  ulong uVar5;
  KException *this_00;
  reference this_01;
  allocator<char> local_41;
  KString local_40;
  int local_20;
  byte local_19;
  GroupedEntityCategory gec;
  KUINT8 i;
  GEDList *GED_local;
  IsGroupOf_PDU *this_local;
  
  _gec = GED;
  GED_local = (GEDList *)this;
  sVar2 = std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
          ::size(GED);
  if (sVar2 != 0) {
    local_19 = 0;
    pvVar3 = std::
             vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
             ::operator[](_gec,0);
    pGVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::operator->(pvVar3);
    local_20 = (*(pGVar4->super_DataTypeBase)._vptr_DataTypeBase[6])();
    while( true ) {
      local_19 = local_19 + 1;
      uVar5 = (ulong)local_19;
      sVar2 = std::
              vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
              ::size(_gec);
      if (sVar2 <= uVar5) break;
      pvVar3 = std::
               vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
               ::operator[](_gec,(ulong)local_19);
      pGVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::operator->(pvVar3);
      iVar1 = (*(pGVar4->super_DataTypeBase)._vptr_DataTypeBase[6])();
      if (iVar1 != local_20) {
        this_00 = (KException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SetGED",&local_41);
        KException::KException(this_00,&local_40,8);
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
    }
    this->m_ui8GrpdEntCat = (KUINT8)local_20;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
    ::clear(&this->m_vpGED);
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
    ::operator=(&this->m_vpGED,_gec);
    sVar2 = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
            ::size(&this->m_vpGED);
    this->m_ui8NumOfGroupedEnts = (KUINT8)sVar2;
    (this->super_Header).super_Header6.m_ui16PDULength = 0x28;
    for (local_19 = 0; uVar5 = (ulong)local_19,
        sVar2 = std::
                vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                ::size(_gec), uVar5 < sVar2; local_19 = local_19 + 1) {
      this_01 = std::
                vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                ::operator[](&this->m_vpGED,(ulong)local_19);
      pGVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::operator->(this_01);
      iVar1 = (*(pGVar4->super_DataTypeBase)._vptr_DataTypeBase[7])();
      (this->super_Header).super_Header6.m_ui16PDULength =
           (this->super_Header).super_Header6.m_ui16PDULength + (ushort)(byte)iVar1;
    }
  }
  return;
}

Assistant:

void IsGroupOf_PDU::SetGED(const GEDList &GED) noexcept(false)
{
    if( GED.size() == 0 )return;

    KUINT8 i = 0;

    GroupedEntityCategory gec = GED[i]->GetGroupedEntityCategory();
    ++i;

    while( i < GED.size() )
    {
        if( GED[i]->GetGroupedEntityCategory() != gec )throw KException( __FUNCTION__, INVALID_DATA );
        ++i;
    }

    m_ui8GrpdEntCat = gec;

    m_vpGED.clear();

    m_vpGED = GED;

    m_ui8NumOfGroupedEnts = m_vpGED.size();

    // Calc new PDU length.
    m_ui16PDULength = IS_GROUP_OF_PDU_SIZE;

    i = 0;

    while( i < GED.size() )
    {
        m_ui16PDULength += m_vpGED[i]->GetLength();
        ++i;
    }
}